

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketExtensions.h
# Opt level: O1

void __thiscall
uWS::ExtensionsNegotiator<true>::readOffer(ExtensionsNegotiator<true> *this,string_view offer)

{
  uint uVar1;
  ExtensionsParser extensionsParser;
  ExtensionsParser local_20;
  
  ExtensionsParser::ExtensionsParser(&local_20,offer._M_str,offer._M_len);
  uVar1 = this->options;
  if (((uVar1 & 1) == 0) || (local_20.perMessageDeflate != true)) {
    uVar1 = uVar1 & 0xfffffffe;
  }
  else {
    if (((uVar1 & 4) != 0) || (local_20.clientNoContextTakeover != false)) {
      this->options = uVar1 | 4;
    }
    if (local_20.serverNoContextTakeover != true) {
      return;
    }
    uVar1 = this->options | 2;
  }
  this->options = uVar1;
  return;
}

Assistant:

void readOffer(std::string_view offer) {
        if (isServer) {
            ExtensionsParser extensionsParser(offer.data(), offer.length());
            if ((options & PERMESSAGE_DEFLATE) && extensionsParser.perMessageDeflate) {
                if (extensionsParser.clientNoContextTakeover || (options & CLIENT_NO_CONTEXT_TAKEOVER)) {
                    options |= CLIENT_NO_CONTEXT_TAKEOVER;
                }

                /* We leave this option for us to read even if the client did not send it */
                if (extensionsParser.serverNoContextTakeover) {
                    options |= SERVER_NO_CONTEXT_TAKEOVER;
                }/* else {
                    options &= ~SERVER_NO_CONTEXT_TAKEOVER;
                }*/
            } else {
                options &= ~PERMESSAGE_DEFLATE;
            }
        } else {
            // todo!
        }
    }